

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.h
# Opt level: O3

void __thiscall
yyml::nn::Variable<double>::Variable(Variable<double> *this,TensorShape *shape,string *name)

{
  pointer pcVar1;
  vector<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_> local_b8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  TensorShape local_78;
  TensorShape local_48;
  
  local_48.dim = shape->dim;
  local_48.total = shape->total;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48.dims,&shape->dims);
  Tensor<double>::Tensor(&this->values_,&local_48);
  if (local_48.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_78.dim = shape->dim;
  local_78.total = shape->total;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78.dims,&shape->dims);
  Tensor<double>::Tensor(&this->grads_,&local_78);
  if (local_78.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8.
  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  Autograd<double>::Autograd(&this->autograd_,&local_b8,this,(BackwardFunction<double> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_b8.
      super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  return;
}

Assistant:

Variable(TensorShape shape, std::string name)
      : values_(shape),
        grads_(shape),
        autograd_({}, this, nullptr),
        name_(name) {}